

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primecandidate.c
# Opt level: O3

mp_int * pcs_generate(PrimeCandidateSource *s)

{
  uint32_t m;
  uint32_t uVar1;
  uint32_t uVar2;
  mp_int *x;
  mp_int *r;
  uint32_t uVar3;
  ulong uVar4;
  
  if (s->ready == false) {
    __assert_fail("s->ready",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/primecandidate.c"
                  ,0x172,"mp_int *pcs_generate(PrimeCandidateSource *)");
  }
  if (s->one_shot == true) {
    if (s->thrown_away_my_shot != false) {
      return (mp_int *)0x0;
    }
    s->thrown_away_my_shot = true;
  }
  while (x = mp_random_upto_fn(s->limit,random_read), s->navoids != 0) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    while( true ) {
      m = s->avoids[uVar4].mod;
      uVar1 = s->avoids[uVar4].res;
      if (uVar3 != m) {
        uVar2 = mp_mod_known_integer(x,m);
        uVar3 = m;
      }
      if (uVar2 == uVar1) break;
      uVar4 = uVar4 + 1;
      if (s->navoids <= uVar4) goto LAB_0010b800;
    }
    mp_free(x);
    if (s->one_shot == true) {
      return (mp_int *)0x0;
    }
  }
LAB_0010b800:
  r = mp_new((ulong)s->bits);
  mp_mul_into(r,x,s->factor);
  mp_add_into(r,r,s->addend);
  mp_free(x);
  return r;
}

Assistant:

mp_int *pcs_generate(PrimeCandidateSource *s)
{
    assert(s->ready);
    if (s->one_shot) {
        if (s->thrown_away_my_shot)
            return NULL;
        s->thrown_away_my_shot = true;
    }

    while (true) {
        mp_int *x = mp_random_upto(s->limit);

        int64_t x_res = 0, last_mod = 0;
        bool ok = true;

        for (size_t i = 0; i < s->navoids; i++) {
            int64_t mod = s->avoids[i].mod, avoid_res = s->avoids[i].res;

            if (mod != last_mod) {
                last_mod = mod;
                x_res = mp_mod_known_integer(x, mod);
            }

            if (x_res == avoid_res) {
                ok = false;
                break;
            }
        }

        if (!ok) {
            mp_free(x);
            if (s->one_shot)
                return NULL;
            continue; /* try a new x */
        }

        /*
         * We've found a viable x. Make the final output value.
         */
        mp_int *toret = mp_new(s->bits);
        mp_mul_into(toret, x, s->factor);
        mp_add_into(toret, toret, s->addend);
        mp_free(x);
        return toret;
    }
}